

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPHashAlgorithm.cpp
# Opt level: O1

bool __thiscall OSSLEVPHashAlgorithm::hashInit(OSSLEVPHashAlgorithm *this)

{
  bool bVar1;
  int iVar2;
  EVP_MD_CTX *ctx;
  undefined4 extraout_var;
  ByteString dummy;
  ByteString local_40;
  
  bVar1 = HashAlgorithm::hashInit(&this->super_HashAlgorithm);
  if (bVar1) {
    ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
    this->curCTX = (EVP_MD_CTX *)ctx;
    if (ctx == (EVP_MD_CTX *)0x0) {
      softHSMLog(3,"hashInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPHashAlgorithm.cpp"
                 ,0x37,"Failed to allocate space for EVP_MD_CTX");
      return false;
    }
    iVar2 = (*(this->super_HashAlgorithm)._vptr_HashAlgorithm[6])(this);
    iVar2 = EVP_DigestInit_ex(ctx,(EVP_MD *)CONCAT44(extraout_var,iVar2),(ENGINE *)0x0);
    if (iVar2 != 0) {
      return true;
    }
    softHSMLog(3,"hashInit",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPHashAlgorithm.cpp"
               ,0x3f,"EVP_DigestInit failed");
    EVP_MD_CTX_free(this->curCTX);
    this->curCTX = (EVP_MD_CTX *)0x0;
    ByteString::ByteString(&local_40);
    HashAlgorithm::hashFinal(&this->super_HashAlgorithm,&local_40);
    local_40._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_40.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  return false;
}

Assistant:

bool OSSLEVPHashAlgorithm::hashInit()
{
	if (!HashAlgorithm::hashInit())
	{
		return false;
	}

	// Initialize the context
	curCTX = EVP_MD_CTX_new();
	if (curCTX == NULL)
	{
		ERROR_MSG("Failed to allocate space for EVP_MD_CTX");

		return false;
	}

	// Initialize EVP digesting
	if (!EVP_DigestInit_ex(curCTX, getEVPHash(), NULL))
	{
		ERROR_MSG("EVP_DigestInit failed");

		EVP_MD_CTX_free(curCTX);
		curCTX = NULL;

		ByteString dummy;
		HashAlgorithm::hashFinal(dummy);

		return false;
	}

	return true;
}